

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::report_selfint_face
          (tetgenmesh *this,point p1,point p2,point p3,face *sface,triface *iedge,int intflag,
          int *types,int *poss)

{
  uint uVar1;
  int iVar2;
  tetrahedron ppdVar3;
  double *pdVar4;
  bool bVar5;
  point pdVar6;
  int *piVar7;
  long lVar8;
  undefined4 *puVar9;
  point pdVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  point pdVar14;
  uint uVar15;
  char *__format;
  uint uVar16;
  double *e1;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  point local_78;
  double ip [3];
  double u;
  
  uVar15 = *(uint *)((long)sface->sh + (long)this->shmarkindex * 4);
  ppdVar3 = iedge->tet[9];
  if (ppdVar3 == (tetrahedron)0x0) {
LAB_0011bbc5:
    ppdVar3 = iedge->tet[8];
    if ((ppdVar3 != (tetrahedron)0x0) &&
       (pdVar4 = ppdVar3[ver2edge[iedge->ver]], pdVar4 != (double *)0x0)) {
      uVar13 = (uint)pdVar4 & 7;
      uVar18 = (ulong)uVar13;
      local_78 = (point)((ulong)pdVar4 & 0xfffffffffffffff8);
      dVar19 = local_78[snextpivot[snextpivot[uVar18]] >> 1];
      pdVar14 = local_78;
      uVar17 = uVar18;
      while (pdVar10 = (point)((ulong)dVar19 & 0xfffffffffffffff8), pdVar10 != (point)0x0) {
        uVar16 = SUB84(dVar19,0) & 7;
        uVar17 = (ulong)snextpivot
                        [snextpivot
                         [pdVar10[sorgpivot[uVar16]] != pdVar14[sorgpivot[uVar17]] ^ uVar16]];
        pdVar14 = pdVar10;
        dVar19 = pdVar10[snextpivot[snextpivot[uVar17]] >> 1];
      }
      dVar19 = local_78[snextpivot[uVar18] >> 1];
      pdVar10 = local_78;
      while (pdVar6 = (point)((ulong)dVar19 & 0xfffffffffffffff8), pdVar6 != (point)0x0) {
        uVar16 = SUB84(dVar19,0) & 7;
        uVar18 = (ulong)snextpivot
                        [pdVar6[sdestpivot[uVar16]] != pdVar10[sdestpivot[uVar18]] ^ uVar16];
        pdVar10 = pdVar6;
        dVar19 = pdVar6[snextpivot[uVar18] >> 1];
      }
      e1 = (double *)pdVar14[sorgpivot[uVar17]];
      pdVar10 = pdVar10 + sdestpivot[uVar18];
      bVar5 = true;
      dVar19 = 0.0;
      uVar16 = *(uint *)((*(ulong *)((long)local_78 + (ulong)((uint)pdVar4 & 6) * 4) &
                         0xfffffffffffffff8) + (long)this->shmarkindex * 4);
      goto LAB_0011bd9c;
    }
    goto switchD_0011be22_caseD_2;
  }
  pdVar4 = ppdVar3[iedge->ver & 3];
  if (pdVar4 == (double *)0x0) goto LAB_0011bbc5;
  local_78 = (point)((ulong)pdVar4 & 0xfffffffffffffff8);
  uVar13 = tspivottbl[iedge->ver][(uint)pdVar4 & 7];
  e1 = (double *)local_78[sorgpivot[(int)uVar13]];
  pdVar10 = local_78 + sdestpivot[(int)uVar13];
  dVar19 = local_78[sapexpivot[(int)uVar13]];
  bVar5 = false;
  uVar16 = uVar15;
LAB_0011bd9c:
  pdVar4 = (double *)*pdVar10;
  if (intflag == 4) {
    if (*types != 4) goto switchD_0011be22_caseD_2;
    puts("PLC Error:  Two facets are overlapping.");
    lVar8 = (long)this->pointmarkindex;
    printf("  Facet 1:   [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar8 * 4),
           (ulong)*(uint *)((long)pdVar4 + lVar8 * 4),(ulong)*(uint *)((long)dVar19 + lVar8 * 4),
           (ulong)uVar16);
    lVar8 = (long)this->pointmarkindex;
    uVar13 = *(uint *)((long)p1 + lVar8 * 4);
    uVar16 = *(uint *)((long)p2 + lVar8 * 4);
    uVar1 = *(uint *)((long)p3 + lVar8 * 4);
    __format = "  Facet 2:   [%d,%d,%d] #%d\n";
LAB_0011c1b2:
    printf(__format,(ulong)uVar13,(ulong)uVar16,(ulong)uVar1,(ulong)uVar15);
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 3;
  }
  else {
    if (intflag == 2) {
      u = 0.0;
      planelineint((tetgenmesh *)ip,p1,p2,p3,e1,pdVar4,ip,&u);
      switch(*types) {
      case 5:
      case 6:
        if (poss[1] == 0) {
          piVar7 = orgpivot;
        }
        else {
          if (poss[1] != 1) break;
          piVar7 = destpivot;
        }
        ppdVar3 = iedge->tet[piVar7[iedge->ver]];
        if (2 < (*(int *)((long)ppdVar3 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U) {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*ppdVar3,ppdVar3[1],
                 ppdVar3[2]);
          printf("  Vertex:  #%d\n",(ulong)*(uint *)((long)ppdVar3 + (long)this->pointmarkindex * 4)
                );
          iVar2 = this->pointmarkindex;
LAB_0011c19c:
          lVar8 = (long)iVar2;
          puVar12 = (uint *)((long)p2 + lVar8 * 4);
          puVar11 = (uint *)(lVar8 * 4 + (long)p1);
          __format = "  Facet:   [%d,%d,%d] #%d\n";
          local_78 = p3;
          goto LAB_0011c1a3;
        }
        break;
      case 7:
        iVar2 = *poss;
        pdVar14 = p1;
        if (((iVar2 != 0) && (pdVar14 = p3, iVar2 != 2)) && (pdVar14 = p2, iVar2 != 1)) {
          terminatetetgen(this,2);
          pdVar14 = (point)0x0;
        }
        if (2 < (*(int *)((long)pdVar14 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U) {
          if (bVar5) {
            printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",*pdVar14,
                   pdVar14[1],pdVar14[2]);
            printf("  Vertex:  #%d\n",
                   (ulong)*(uint *)((long)pdVar14 + (long)this->pointmarkindex * 4));
            puVar11 = (uint *)((long)e1 + (long)this->pointmarkindex * 4);
            puVar12 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4);
            lVar8 = (long)this->shmarkindex;
            __format = "  Segment: [%d,%d] #%d (%d)\n";
            uVar15 = uVar16;
            goto LAB_0011c1a3;
          }
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*pdVar14,pdVar14[1],
                 pdVar14[2]);
          printf("  Vertex:  #%d\n",(ulong)*(uint *)((long)pdVar14 + (long)this->pointmarkindex * 4)
                );
          iVar2 = this->pointmarkindex;
          goto LAB_0011c19c;
        }
        break;
      case 8:
      case 9:
        if (bVar5) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
          printf("  Segment: [%d,%d] #%d (%d)\n",
                 (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)pdVar4 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)local_78 + (long)this->shmarkindex * 4),(ulong)uVar16);
          iVar2 = this->pointmarkindex;
          __format = "  Facet:   [%d,%d,%d] #%d\n";
        }
        else {
          printf("PLC Error:  Two facets intersect at point");
          printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
          lVar8 = (long)this->pointmarkindex;
          printf("  Facet 1: [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar8 * 4),
                 (ulong)*(uint *)((long)pdVar4 + lVar8 * 4),
                 (ulong)*(uint *)((long)local_78[sorgpivot[(int)uVar13]] + lVar8 * 4),
                 (ulong)*(uint *)((long)local_78 + (long)this->shmarkindex * 4));
          iVar2 = this->pointmarkindex;
          __format = "  Facet 2: [%d,%d,%d] #%d\n";
        }
        lVar8 = (long)iVar2;
        puVar12 = (uint *)((long)p2 + lVar8 * 4);
        puVar11 = (uint *)((long)p1 + lVar8 * 4);
        local_78 = p3;
LAB_0011c1a3:
        uVar13 = *puVar11;
        uVar16 = *puVar12;
        uVar1 = *(uint *)((long)local_78 + lVar8 * 4);
        goto LAB_0011c1b2;
      }
    }
switchD_0011be22_caseD_2:
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 2;
  }
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

int tetgenmesh::report_selfint_face(point p1, point p2, point p3, face* sface,
  triface* iedge, int intflag, int* types, int* poss)
{
  face iface;
  point e1 = NULL, e2 = NULL, e3 = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  geomtag = shellmark(*sface);

  if (issubface(*iedge)) {
    tspivot(*iedge, iface);
    e1 = sorg(iface);
    e2 = sdest(iface);
    e3 = sapex(iface);
    etype = 2;
    facemark = geomtag;
  } else if (issubseg(*iedge)) {
    tsspivot1(*iedge, iface);
    e1 = farsorg(iface);
    e2 = farsdest(iface);
    etype = 1;
    face parentsh;
    spivot(iface, parentsh);
    facemark = shellmark(parentsh);
  } else {
    terminatetetgen(this, 2);
  }

  if (intflag == 2) {
    // The triangle and the edge intersect only at one point.
    REAL ip[3], u = 0;
    planelineint(p1, p2, p3, e1, e2, ip, &u);
    if ((types[0] == (int) ACROSSFACE) ||
        (types[0] == (int) ACROSSEDGE)) {
      // The triangle and the edge intersect in their interiors. 
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
               shellmark(iface), facemark);
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        printf("PLC Error:  Two facets intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d,%d,%d] #%d\n", pointmark(e1), pointmark(e2),
               pointmark(sorg(iface)), shellmark(iface));
        printf("  Facet 2: [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      }
    } else if (types[0] == (int) ACROSSVERT) {
      // A vertex of the triangle and the edge intersect.
      point crosspt = NULL;
      if (poss[0] == 0) {
        crosspt = p1;
      } else if (poss[0] == 1) {
        crosspt = p2;
      } else if (poss[0] == 2) {
        crosspt = p3;
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(crosspt)) {
        if (etype == 1) {
          printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
                 shellmark(iface), facemark);
        } else {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
                 pointmark(p2), pointmark(p3), geomtag);
        }
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if ((types[0] == (int) TOUCHFACE) ||
               (types[0] == (int) TOUCHEDGE)) {
      // The triangle and a vertex of the edge intersect.
      point touchpt = NULL;
      if (poss[1] == 0) {
        touchpt = org(*iedge);
      } else if (poss[1] == 1) {
        touchpt = dest(*iedge);
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(touchpt)) {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
               touchpt[0], touchpt[1], touchpt[2]);
        printf("  Vertex:  #%d\n", pointmark(touchpt));
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if (types[0] == (int) SHAREVERT) {
      terminatetetgen(this, 2);
    } else {
      terminatetetgen(this, 2);
    }
  } else if (intflag == 4) {
    if (types[0] == (int) SHAREFACE) {
      printf("PLC Error:  Two facets are overlapping.\n");
      printf("  Facet 1:   [%d,%d,%d] #%d\n", pointmark(e1), 
             pointmark(e2), pointmark(e3), facemark);
      printf("  Facet 2:   [%d,%d,%d] #%d\n", pointmark(p1), 
             pointmark(p2), pointmark(p3), geomtag);
    } else {
      terminatetetgen(this, 2);
    }
  } else {
    terminatetetgen(this, 2);
  }

  terminatetetgen(this, 3);
  return 0;
}